

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQChar * __thiscall SQLexer::Tok2Str(SQLexer *this,SQInteger tok)

{
  SQInteger x;
  SQInteger nitr;
  SQObjectPtr val;
  undefined1 local_40 [8];
  SQObjectPtr key;
  SQObjectPtr itr;
  SQInteger tok_local;
  SQLexer *this_local;
  
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&key.super_SQObject._unVal);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_40);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&nitr);
  do {
    x = SQTable::Next(this->_keywords,false,(SQObjectPtr *)&key.super_SQObject._unVal,
                      (SQObjectPtr *)local_40,(SQObjectPtr *)&nitr);
    if (x == -1) {
      this_local = (SQLexer *)0x0;
      goto LAB_001324e0;
    }
    ::SQObjectPtr::operator=((SQObjectPtr *)&key.super_SQObject._unVal,x);
  } while (val.super_SQObject._0_8_ != tok);
  this_local = (SQLexer *)(key.super_SQObject._0_8_ + 0x38);
LAB_001324e0:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&nitr);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_40);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&key.super_SQObject._unVal);
  return (SQChar *)this_local;
}

Assistant:

const SQChar *SQLexer::Tok2Str(SQInteger tok)
{
    SQObjectPtr itr, key, val;
    SQInteger nitr;
    while((nitr = _keywords->Next(false,itr, key, val)) != -1) {
        itr = (SQInteger)nitr;
        if(((SQInteger)_integer(val)) == tok)
            return _stringval(key);
    }
    return NULL;
}